

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void testing::internal::DeathTestAbort(string *message)

{
  InternalRunDeathTestFlag *this;
  FILE *__stream;
  undefined8 uVar1;
  FILE *parent;
  InternalRunDeathTestFlag *flag;
  char *in_stack_ffffffffffffffd8;
  FILE *pFVar2;
  undefined8 in_stack_ffffffffffffffe0;
  int fd;
  
  fd = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  GetUnitTestImpl();
  this = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)0x14bff6);
  if (this != (InternalRunDeathTestFlag *)0x0) {
    InternalRunDeathTestFlag::write_fd(this);
    __stream = (FILE *)posix::FDOpen(fd,in_stack_ffffffffffffffd8);
    fputc(0x49,__stream);
    pFVar2 = __stream;
    uVar1 = std::__cxx11::string::c_str();
    fprintf(pFVar2,"%s",uVar1);
    fflush(__stream);
    _Exit(1);
  }
  pFVar2 = _stderr;
  uVar1 = std::__cxx11::string::c_str();
  fprintf(pFVar2,"%s",uVar1);
  fflush(_stderr);
  posix::Abort();
}

Assistant:

[[noreturn]] static void DeathTestAbort(const std::string& message) {
  // On a POSIX system, this function may be called from a threadsafe-style
  // death test child process, which operates on a very small stack.  Use
  // the heap for any additional non-minuscule memory requirements.
  const InternalRunDeathTestFlag* const flag =
      GetUnitTestImpl()->internal_run_death_test_flag();
  if (flag != nullptr) {
    FILE* parent = posix::FDOpen(flag->write_fd(), "w");
    fputc(kDeathTestInternalError, parent);
    fprintf(parent, "%s", message.c_str());
    fflush(parent);
    _Exit(1);
  } else {
    fprintf(stderr, "%s", message.c_str());
    fflush(stderr);
    posix::Abort();
  }
}